

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS ref_facelift_import(REF_GRID ref_grid,char *filename)

{
  REF_GEOM pRVar1;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  REF_INT *pRVar5;
  int iVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  REF_GRID freeable_ref_grid;
  REF_FACELIFT ref_facelift;
  REF_DBL geom_xyz [3];
  REF_GRID local_60;
  REF_NODE local_58;
  REF_FACELIFT local_50;
  REF_DBL local_48 [3];
  
  uVar4 = ref_import_by_extension(&local_60,ref_grid->mpi,filename);
  if (uVar4 == 0) {
    pRVar1 = local_60->geom;
    uVar4 = ref_geom_share_context(pRVar1,ref_grid->geom);
    if (uVar4 == 0) {
      if (pRVar1->model != (void *)0x0) {
        uVar4 = ref_egads_mark_jump_degen(local_60);
        if (uVar4 != 0) {
          pcVar9 = "T and UV jumps; UV degen";
          uVar7 = 0x1e2;
          goto LAB_001d5b57;
        }
        uVar4 = ref_geom_verify_topo(local_60);
        if (uVar4 != 0) {
          pcVar9 = "geom topo";
          uVar7 = 0x1e3;
          goto LAB_001d5b57;
        }
        uVar4 = ref_geom_verify_param(local_60);
        if (uVar4 != 0) {
          pcVar9 = "geom param";
          uVar7 = 0x1e4;
          goto LAB_001d5b57;
        }
      }
      uVar4 = ref_facelift_create(&local_50,local_60,0);
      if (uVar4 == 0) {
        ref_grid->geom->ref_facelift = local_50;
        if (local_50->displacement != (REF_DBL *)0x0) {
          pRVar1 = local_50->grid->geom;
          iVar6 = pRVar1->max;
          if (0 < iVar6) {
            local_58 = local_50->grid->node;
            pRVar5 = pRVar1->descr;
            lVar11 = 0;
            lVar10 = 0;
            do {
              if (pRVar5[lVar10 * 6] != -1) {
                uVar4 = ref_egads_eval(pRVar1,(REF_INT)lVar10,local_48,(REF_DBL *)0x0);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x1ca,"ref_facelift_infer_displacement",(ulong)uVar4,"eval geom");
                  goto LAB_001d5d7a;
                }
                pRVar5 = pRVar1->descr;
                iVar6 = pRVar5[lVar10 * 6 + 5];
                pRVar2 = local_58->real;
                pRVar3 = local_50->displacement;
                lVar8 = 0;
                do {
                  *(double *)((long)pRVar3 + lVar8 * 8 + lVar11) =
                       pRVar2[(long)iVar6 * 0xf + lVar8] - local_48[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                iVar6 = pRVar1->max;
              }
              lVar10 = lVar10 + 1;
              lVar11 = lVar11 + 0x18;
            } while (lVar10 < iVar6);
          }
          return 0;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x1c7,"ref_facelift_infer_displacement","requires indirect facelift");
        uVar4 = 1;
LAB_001d5d7a:
        pcVar9 = "infer displacement";
        uVar7 = 0x1e9;
      }
      else {
        pcVar9 = "create";
        uVar7 = 0x1e7;
      }
    }
    else {
      pcVar9 = "share context";
      uVar7 = 0x1df;
    }
  }
  else {
    pcVar9 = "import";
    uVar7 = 0x1dc;
  }
LAB_001d5b57:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar7,
         "ref_facelift_import",(ulong)uVar4,pcVar9);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_import(REF_GRID ref_grid,
                                       const char *filename) {
  REF_GRID freeable_ref_grid;
  REF_FACELIFT ref_facelift;
  REF_GEOM ref_geom;
  RSS(ref_import_by_extension(&freeable_ref_grid, ref_grid_mpi(ref_grid),
                              filename),
      "import");
  ref_geom = ref_grid_geom(freeable_ref_grid);
  RSS(ref_geom_share_context(ref_geom, ref_grid_geom(ref_grid)),
      "share context");
  if (ref_geom_model_loaded(ref_geom)) {
    RSS(ref_egads_mark_jump_degen(freeable_ref_grid),
        "T and UV jumps; UV degen");
    RSS(ref_geom_verify_topo(freeable_ref_grid), "geom topo");
    RSS(ref_geom_verify_param(freeable_ref_grid), "geom param");
  }
  RSS(ref_facelift_create(&ref_facelift, freeable_ref_grid, REF_FALSE),
      "create");
  ref_geom_facelift(ref_grid_geom(ref_grid)) = ref_facelift;
  RSS(ref_facelift_infer_displacement(ref_facelift), "infer displacement");
  return REF_SUCCESS;
}